

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O3

void subQuickSort(char *array,int32_t start,int32_t limit,int32_t itemSize,UComparator *cmp,
                 void *context,void *px,void *pw)

{
  ulong __n;
  int32_t iVar1;
  long lVar2;
  int start_00;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int limit_00;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int local_40;
  
  __n = (ulong)(uint)itemSize;
  lVar2 = (long)itemSize;
  uVar6 = (ulong)(uint)limit;
  do {
    limit_00 = (int)uVar6;
    if (limit_00 <= start + 9) {
      doInsertionSort(array + start * itemSize,limit_00 - start,itemSize,cmp,context,px);
      return;
    }
    memcpy(px,array + (long)((start + limit_00) / 2) * __n,__n);
    uVar5 = uVar6 & 0xffffffff;
    start_00 = start;
    do {
      lVar9 = (long)start_00;
      lVar7 = (lVar9 << 0x20) + -0x100000000;
      lVar10 = lVar9 + -1;
      pcVar8 = array + lVar2 * lVar9;
      do {
        iVar4 = start_00;
        lVar7 = lVar7 + 0x100000000;
        iVar1 = (*cmp)(context,pcVar8,px);
        lVar10 = lVar10 + 1;
        iVar3 = iVar4 + 1;
        pcVar8 = pcVar8 + lVar2;
        start_00 = iVar3;
      } while (iVar1 < 0);
      local_40 = (int)uVar5;
      uVar11 = (ulong)local_40;
      lVar9 = uVar11 << 0x20;
      pcVar8 = array + (uVar11 - 1) * lVar2;
      do {
        uVar5 = uVar11;
        uVar11 = uVar5 - 1;
        iVar1 = (*cmp)(context,px,pcVar8);
        lVar9 = lVar9 + -0x100000000;
        pcVar8 = pcVar8 + -lVar2;
      } while (iVar1 < 0);
      start_00 = iVar4;
      if ((lVar10 < (long)uVar5) && (uVar5 = uVar11, start_00 = iVar3, lVar10 < (long)uVar11)) {
        memcpy(pw,array + (lVar7 >> 0x20) * __n,__n);
        memcpy(array + (lVar7 >> 0x20) * __n,array + (lVar9 >> 0x20) * __n,__n);
        memcpy(array + (lVar9 >> 0x20) * __n,pw,__n);
      }
      iVar4 = (int)uVar5;
    } while (start_00 < iVar4);
    if (iVar4 - start < limit_00 - start_00) {
      uVar5 = uVar6;
      if (start < iVar4 + -1) {
        subQuickSort(array,start,iVar4,itemSize,cmp,context,px,pw);
      }
    }
    else if (start_00 < limit_00 + -1) {
      subQuickSort(array,start_00,limit_00,itemSize,cmp,context,px,pw);
      start_00 = start;
    }
    else {
      uVar5 = uVar5 & 0xffffffff;
      start_00 = start;
    }
    start = start_00;
    uVar6 = uVar5;
  } while (start < (int)uVar5 + -1);
  return;
}

Assistant:

static void
subQuickSort(char *array, int32_t start, int32_t limit, int32_t itemSize,
             UComparator *cmp, const void *context,
             void *px, void *pw) {
    int32_t left, right;

    /* start and left are inclusive, limit and right are exclusive */
    do {
        if((start+MIN_QSORT)>=limit) {
            doInsertionSort(array+start*itemSize, limit-start, itemSize, cmp, context, px);
            break;
        }

        left=start;
        right=limit;

        /* x=array[middle] */
        uprv_memcpy(px, array+(size_t)((start+limit)/2)*itemSize, itemSize);

        do {
            while(/* array[left]<x */
                  cmp(context, array+left*itemSize, px)<0
            ) {
                ++left;
            }
            while(/* x<array[right-1] */
                  cmp(context, px, array+(right-1)*itemSize)<0
            ) {
                --right;
            }

            /* swap array[left] and array[right-1] via w; ++left; --right */
            if(left<right) {
                --right;

                if(left<right) {
                    uprv_memcpy(pw, array+(size_t)left*itemSize, itemSize);
                    uprv_memcpy(array+(size_t)left*itemSize, array+(size_t)right*itemSize, itemSize);
                    uprv_memcpy(array+(size_t)right*itemSize, pw, itemSize);
                }

                ++left;
            }
        } while(left<right);

        /* sort sub-arrays */
        if((right-start)<(limit-left)) {
            /* sort [start..right[ */
            if(start<(right-1)) {
                subQuickSort(array, start, right, itemSize, cmp, context, px, pw);
            }

            /* sort [left..limit[ */
            start=left;
        } else {
            /* sort [left..limit[ */
            if(left<(limit-1)) {
                subQuickSort(array, left, limit, itemSize, cmp, context, px, pw);
            }

            /* sort [start..right[ */
            limit=right;
        }
    } while(start<(limit-1));
}